

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

LY_ERR lys_find_xpath_atoms
                 (ly_ctx *ctx,lysc_node *ctx_node,char *xpath,uint32_t options,ly_set **set)

{
  ly_ctx *plVar1;
  uint32_t options_00;
  LY_ERR LVar2;
  lyd_node **pplVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  lyxp_expr *exp;
  lyxp_set xp_set;
  
  memset(&xp_set,0,0x90);
  exp = (lyxp_expr *)0x0;
  if (ctx == (ly_ctx *)0x0 && ctx_node == (lysc_node *)0x0) {
    pcVar4 = "ctx || ctx_node";
  }
  else if (xpath == (char *)0x0) {
    pcVar4 = "xpath";
  }
  else {
    if (set != (ly_set **)0x0) {
      if ((ctx != (ly_ctx *)0x0 && ctx_node != (lysc_node *)0x0) &&
         (plVar1 = ctx_node->module->ctx, plVar1 != ctx && plVar1 != (ly_ctx *)0x0)) {
        ly_log(ctx,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
        return LY_EINVAL;
      }
      options_00 = options | 4;
      if ((options & 0x1c) != 0) {
        options_00 = options;
      }
      if (ctx == (ly_ctx *)0x0) {
        ctx = ctx_node->module->ctx;
      }
      LVar2 = ly_set_new(set);
      if (((LVar2 == LY_SUCCESS) &&
          (LVar2 = lyxp_expr_parse(ctx,xpath,0,'\x01',&exp), LVar2 == LY_SUCCESS)) &&
         (LVar2 = lyxp_atomize(ctx,exp,(lys_module *)0x0,LY_VALUE_JSON,(void *)0x0,ctx_node,ctx_node
                               ,&xp_set,options_00), LVar2 == LY_SUCCESS)) {
        pplVar3 = (lyd_node **)malloc((ulong)xp_set.used << 3);
        ((*set)->field_2).dnodes = pplVar3;
        if (((*set)->field_2).dnodes == (lyd_node **)0x0) {
          LVar2 = LY_EMEM;
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_find_xpath_atoms");
        }
        else {
          (*set)->size = xp_set.used;
          if (xp_set.used == 0) {
            LVar2 = LY_SUCCESS;
          }
          else {
            lVar5 = 8;
            uVar6 = 0;
            do {
              if ((*(int *)((long)&(xp_set.val.nodes)->node + lVar5) == 3) &&
                 (LVar2 = ly_set_add(*set,*(void **)((long)xp_set.val.nodes + lVar5 + -8),'\x01',
                                     (uint32_t *)0x0), LVar2 != LY_SUCCESS)) break;
              uVar6 = uVar6 + 1;
              lVar5 = lVar5 + 0x18;
              LVar2 = LY_SUCCESS;
            } while (uVar6 < xp_set.used);
          }
        }
      }
      lyxp_set_free_content(&xp_set);
      lyxp_expr_free(ctx,exp);
      return LVar2;
    }
    pcVar4 = "set";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar4,
         "lys_find_xpath_atoms");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_find_xpath_atoms(const struct ly_ctx *ctx, const struct lysc_node *ctx_node, const char *xpath, uint32_t options,
        struct ly_set **set)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxp_set xp_set = {0};
    struct lyxp_expr *exp = NULL;
    uint32_t i;

    LY_CHECK_ARG_RET(NULL, ctx || ctx_node, xpath, set, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(ctx, ctx_node ? ctx_node->module->ctx : NULL, LY_EINVAL);
    if (!(options & LYXP_SCNODE_ALL)) {
        options |= LYXP_SCNODE;
    }
    if (!ctx) {
        ctx = ctx_node->module->ctx;
    }

    /* allocate return set */
    ret = ly_set_new(set);
    LY_CHECK_GOTO(ret, cleanup);

    /* compile expression */
    ret = lyxp_expr_parse(ctx, xpath, 0, 1, &exp);
    LY_CHECK_GOTO(ret, cleanup);

    /* atomize expression */
    ret = lyxp_atomize(ctx, exp, NULL, LY_VALUE_JSON, NULL, ctx_node, ctx_node, &xp_set, options);
    LY_CHECK_GOTO(ret, cleanup);

    /* transform into ly_set */
    (*set)->objs = malloc(xp_set.used * sizeof *(*set)->objs);
    LY_CHECK_ERR_GOTO(!(*set)->objs, LOGMEM(ctx); ret = LY_EMEM, cleanup);
    (*set)->size = xp_set.used;

    for (i = 0; i < xp_set.used; ++i) {
        if (xp_set.val.scnodes[i].type == LYXP_NODE_ELEM) {
            ret = ly_set_add(*set, xp_set.val.scnodes[i].scnode, 1, NULL);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    lyxp_set_free_content(&xp_set);
    lyxp_expr_free(ctx, exp);
    return ret;
}